

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

HMODULE LOADLoadLibrary(LPCSTR shortAsciiName,BOOL fDynamic)

{
  int iVar1;
  void *dl_handle;
  HMODULE pVVar2;
  char *libraryNameOrPath;
  
  iVar1 = strcmp(shortAsciiName,"libc");
  libraryNameOrPath = "libc.so.6";
  if (iVar1 != 0) {
    libraryNameOrPath = shortAsciiName;
  }
  LockModuleList();
  dl_handle = LOADLoadLibraryDirect(libraryNameOrPath);
  if (dl_handle == (void *)0x0) {
    pVVar2 = (HMODULE)0x0;
  }
  else {
    pVVar2 = LOADRegisterLibraryDirect(dl_handle,libraryNameOrPath,fDynamic);
  }
  UnlockModuleList();
  return pVVar2;
}

Assistant:

static HMODULE LOADLoadLibrary(LPCSTR shortAsciiName, BOOL fDynamic)
{
    HMODULE module = nullptr;
    void *dl_handle = nullptr;

    // Check whether we have been requested to load 'libc'. If that's the case then use the
    // full name of the library that is defined in <gnu/lib-names.h> by the LIBC_SO constant.
    // The problem is that calling dlopen("libc.so") will fail for libc even thought it works
    // for other libraries. The reason is that libc.so is just linker script (i.e. a test file).
    // As a result, we have to use the full name (i.e. lib.so.6) that is defined by LIBC_SO.
    if (strcmp(shortAsciiName, LIBC_NAME_WITHOUT_EXTENSION) == 0)
    {
#if defined(__APPLE__)
        shortAsciiName = "libc.dylib";
#elif defined(__FreeBSD__)
        shortAsciiName = FREEBSD_LIBC;
#elif defined(LIBC_SO)
        shortAsciiName = LIBC_SO;
#else
        shortAsciiName = "libc.so";
#endif
    }

    LockModuleList();

    dl_handle = LOADLoadLibraryDirect(shortAsciiName);
    if (dl_handle)
    {
        module = LOADRegisterLibraryDirect(dl_handle, shortAsciiName, fDynamic);
    }

    UnlockModuleList();

    return module;
}